

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date.cpp
# Opt level: O0

void __thiscall Date::Date(Date *this,uint32_t year,Month month,uint32_t day)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  string local_150;
  string local_130;
  string local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  uint32_t local_1c;
  Month local_18;
  uint32_t day_local;
  Month month_local;
  uint32_t year_local;
  Date *this_local;
  
  this->days = 0;
  local_1c = day;
  local_18 = month;
  day_local = year;
  _month_local = this;
  bVar1 = is_date(year,month,day);
  if (!bVar1) {
    std::__cxx11::to_string(&local_100,day_local);
    std::operator+(&local_e0,"Error in Date::Date() - (",&local_100);
    std::operator+(&local_c0,&local_e0,",");
    std::__cxx11::to_string(&local_130,local_18);
    std::operator+(&local_a0,&local_c0,&local_130);
    std::operator+(&local_80,&local_a0,",");
    std::__cxx11::to_string(&local_150,local_1c);
    std::operator+(&local_60,&local_80,&local_150);
    std::operator+(&local_40,&local_60,") is not a valid date.");
    error(&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_100);
  }
  lVar2 = days_untill_year(day_local);
  lVar3 = days_untill_month(local_18,day_local);
  this->days = lVar2 + lVar3 + (ulong)local_1c + -1 + this->days;
  return;
}

Assistant:

Date::Date(uint32_t year, Month month, uint32_t day) : days{0}
{
	if (!is_date(year, month, day))
	{
		error("Error in Date::Date() - (" + std::to_string(year)
			+ ","
			+ std::to_string(int(month)) 
			+ ","
			+ std::to_string(day)
			+ ") is not a valid date."
		);
	}
	days += days_untill_year(year) + days_untill_month(month, year) + day - 1;
}